

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ArrayFeatureType::MergeFrom(ArrayFeatureType *this,ArrayFeatureType *from)

{
  uint32_t uVar1;
  ulong uVar2;
  LogMessage *other;
  ArrayFeatureType_EnumeratedShapes *pAVar3;
  ArrayFeatureType_ShapeRange *pAVar4;
  undefined1 *puVar5;
  Arena *pAVar6;
  int32_t iVar7;
  DefaultOptionalValueUnion DVar8;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/FeatureTypes.pb.cc"
               ,0xbbe);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  google::protobuf::RepeatedField<long>::MergeFrom(&this->shape_,&from->shape_);
  if (from->datatype_ != 0) {
    this->datatype_ = from->datatype_;
  }
  if (from->_oneof_case_[0] == 0x1f) {
    if (this->_oneof_case_[0] != 0x1f) {
      clear_ShapeFlexibility(this);
      this->_oneof_case_[0] = 0x1f;
      uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar6 = (Arena *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        pAVar6 = *(Arena **)pAVar6;
      }
      pAVar4 = google::protobuf::Arena::
               CreateMaybeMessage<CoreML::Specification::ArrayFeatureType_ShapeRange>(pAVar6);
      (this->ShapeFlexibility_).shaperange_ = pAVar4;
    }
    if (from->_oneof_case_[0] == 0x1f) {
      puVar5 = (undefined1 *)(from->ShapeFlexibility_).shaperange_;
    }
    else {
      puVar5 = _ArrayFeatureType_ShapeRange_default_instance_;
    }
    ArrayFeatureType_ShapeRange::MergeFrom
              ((this->ShapeFlexibility_).shaperange_,(ArrayFeatureType_ShapeRange *)puVar5);
  }
  else if (from->_oneof_case_[0] == 0x15) {
    if (this->_oneof_case_[0] != 0x15) {
      clear_ShapeFlexibility(this);
      this->_oneof_case_[0] = 0x15;
      uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar6 = (Arena *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        pAVar6 = *(Arena **)pAVar6;
      }
      pAVar3 = google::protobuf::Arena::
               CreateMaybeMessage<CoreML::Specification::ArrayFeatureType_EnumeratedShapes>(pAVar6);
      (this->ShapeFlexibility_).enumeratedshapes_ = pAVar3;
    }
    if (from->_oneof_case_[0] == 0x15) {
      puVar5 = (undefined1 *)(from->ShapeFlexibility_).enumeratedshapes_;
    }
    else {
      puVar5 = _ArrayFeatureType_EnumeratedShapes_default_instance_;
    }
    ArrayFeatureType_EnumeratedShapes::MergeFrom
              ((this->ShapeFlexibility_).enumeratedshapes_,
               (ArrayFeatureType_EnumeratedShapes *)puVar5);
  }
  uVar1 = from->_oneof_case_[1];
  if (uVar1 == 0x3d) {
    if (uVar1 == 0x3d) {
      DVar8 = from->defaultOptionalValue_;
    }
    else {
      DVar8.doubledefaultvalue_ = 0.0;
    }
    if (this->_oneof_case_[1] != 0x3d) {
      this->_oneof_case_[1] = 0x3d;
    }
    (this->defaultOptionalValue_).doubledefaultvalue_ = (double)DVar8;
  }
  else if (uVar1 == 0x33) {
    if (uVar1 == 0x33) {
      iVar7 = (from->defaultOptionalValue_).intdefaultvalue_;
    }
    else {
      iVar7 = 0;
    }
    if (this->_oneof_case_[1] != 0x33) {
      this->_oneof_case_[1] = 0x33;
    }
    (this->defaultOptionalValue_).intdefaultvalue_ = iVar7;
  }
  else if (uVar1 == 0x29) {
    iVar7 = (from->defaultOptionalValue_).intdefaultvalue_;
    if (this->_oneof_case_[1] != 0x29) {
      this->_oneof_case_[1] = 0x29;
    }
    (this->defaultOptionalValue_).intdefaultvalue_ = iVar7;
  }
  uVar2 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar2 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void ArrayFeatureType::MergeFrom(const ArrayFeatureType& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.ArrayFeatureType)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  shape_.MergeFrom(from.shape_);
  if (from._internal_datatype() != 0) {
    _internal_set_datatype(from._internal_datatype());
  }
  switch (from.ShapeFlexibility_case()) {
    case kEnumeratedShapes: {
      _internal_mutable_enumeratedshapes()->::CoreML::Specification::ArrayFeatureType_EnumeratedShapes::MergeFrom(from._internal_enumeratedshapes());
      break;
    }
    case kShapeRange: {
      _internal_mutable_shaperange()->::CoreML::Specification::ArrayFeatureType_ShapeRange::MergeFrom(from._internal_shaperange());
      break;
    }
    case SHAPEFLEXIBILITY_NOT_SET: {
      break;
    }
  }
  switch (from.defaultOptionalValue_case()) {
    case kIntDefaultValue: {
      _internal_set_intdefaultvalue(from._internal_intdefaultvalue());
      break;
    }
    case kFloatDefaultValue: {
      _internal_set_floatdefaultvalue(from._internal_floatdefaultvalue());
      break;
    }
    case kDoubleDefaultValue: {
      _internal_set_doubledefaultvalue(from._internal_doubledefaultvalue());
      break;
    }
    case DEFAULTOPTIONALVALUE_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}